

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

long testSerializeQuoteRequest(int count)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  double dVar5;
  timeval tv;
  NoRelatedSym noRelatedSym;
  QuoteRequest message;
  undefined1 local_298 [16];
  _Alloc_hider local_288 [2];
  char local_278 [16];
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  field_metrics local_248;
  long *local_240;
  long local_238;
  long local_230 [2];
  long *local_220 [2];
  long local_210 [2];
  undefined1 local_200 [16];
  _Alloc_hider local_1f0;
  char local_1e0 [16];
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  field_metrics local_1b0;
  uint local_190;
  QuoteRequest local_188;
  
  local_298._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"1","");
  local_200._0_8_ = &PTR__FieldBase_0011c4b8;
  local_200._8_4_ = 0x83;
  local_1f0._M_p = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_298._0_8_,
             (long)(pointer *)local_298._0_8_ + CONCAT44(local_298._12_4_,local_298._8_4_));
  local_1d0._M_p = (pointer)&local_1c0;
  local_1c8 = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0.m_length = 0;
  local_1b0.m_checksum = 0;
  local_200._0_8_ = &PTR__FieldBase_0011c8b8;
  FIX42::QuoteRequest::QuoteRequest(&local_188,(QuoteReqID *)local_200);
  FIX::FieldBase::~FieldBase((FieldBase *)local_200);
  if ((_Alloc_hider *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,(ulong)(local_288[0]._M_p + 1));
  }
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)local_200);
  iVar4 = 10;
  do {
    local_240 = local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"IBM","");
    local_298._0_8_ = &PTR__FieldBase_0011c4b8;
    local_298._8_4_ = 0x37;
    local_288[0]._M_p = local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_288,local_240,local_238 + (long)local_240);
    local_268._M_p = (pointer)&local_258;
    local_260 = 0;
    local_258._M_local_buf[0] = '\0';
    local_248.m_length = 0;
    local_248.m_checksum = 0;
    local_298._0_8_ = &PTR__FieldBase_0011c5e0;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_298,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_298);
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    FIX::StringField::StringField((StringField *)local_298,200);
    local_298._0_8_ = &PTR__FieldBase_0011c730;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_298,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_298);
    FIX::IntField::IntField((IntField *)local_298,0xc9,0);
    local_298._0_8_ = &PTR__FieldBase_0011c768;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_298,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_298);
    FIX::DoubleField::DoubleField((DoubleField *)local_298,0xca,120.0,0);
    local_298._0_8_ = &PTR__FieldBase_0011c7d8;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_298,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_298);
    FIX::CharField::CharField((CharField *)local_298,0x36,'1');
    local_298._0_8_ = &PTR__FieldBase_0011c618;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_298,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_298);
    FIX::DoubleField::DoubleField((DoubleField *)local_298,0x26,100.0,0);
    local_298._0_8_ = &PTR__FieldBase_0011c848;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_298,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_298);
    local_240 = local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"USD","");
    local_298._0_8_ = &PTR__FieldBase_0011c4b8;
    local_298._8_4_ = 0xf;
    local_288[0]._M_p = local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_288,local_240,local_238 + (long)local_240);
    local_268._M_p = (pointer)&local_258;
    local_260 = 0;
    local_258._M_local_buf[0] = '\0';
    local_248.m_length = 0;
    local_248.m_checksum = 0;
    local_298._0_8_ = &PTR__FieldBase_0011c880;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_298,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_298);
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    FIX::CharField::CharField((CharField *)local_298,0x28,'1');
    local_298._0_8_ = &PTR__FieldBase_0011c6c0;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_298,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_298);
    FIX::FieldMap::addGroup((int)&local_188,(FieldMap *)(ulong)local_190,false);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  gettimeofday((timeval *)local_298,(__timezone_ptr_t)0x0);
  uVar3 = local_298._0_8_;
  lVar1 = CONCAT44(local_298._12_4_,local_298._8_4_);
  if (0 < count) {
    do {
      FIX::Message::toString_abi_cxx11_((int)local_220,(int)&local_188,8);
      if (local_220[0] != local_210) {
        operator_delete(local_220[0],local_210[0] + 1);
      }
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday((timeval *)local_298,(__timezone_ptr_t)0x0);
  dVar5 = (double)(long)local_298._0_8_;
  lVar2 = CONCAT44(local_298._12_4_,local_298._8_4_);
  FIX::FieldMap::~FieldMap((FieldMap *)local_200);
  FIX::Message::~Message((Message *)&local_188);
  return (lVar2 - (lVar1 + (long)((double)(long)uVar3 * 1000000.0))) + (long)(dVar5 * 1000000.0);
}

Assistant:

long testSerializeQuoteRequest(int count) {
  FIX42::QuoteRequest message(FIX::QuoteReqID("1"));
  FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

  for (int i = 1; i <= 10; ++i) {
    noRelatedSym.set(FIX::Symbol("IBM"));
    noRelatedSym.set(FIX::MaturityMonthYear());
    noRelatedSym.set(FIX::PutOrCall(FIX::PutOrCall_PUT));
    noRelatedSym.set(FIX::StrikePrice(120));
    noRelatedSym.set(FIX::Side(FIX::Side_BUY));
    noRelatedSym.set(FIX::OrderQty(100));
    noRelatedSym.set(FIX::Currency("USD"));
    noRelatedSym.set(FIX::OrdType(FIX::OrdType_MARKET));
    message.addGroup(noRelatedSym);
  }

  count = count - 1;

  long start = GetTickCount();
  for (int j = 0; j <= count; ++j) {
    message.toString();
  }
  return GetTickCount() - start;
}